

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive-solver.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::
build_constraints<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
          (exhaustive_solver<baryonyx::itm::maximize_tag,double> *this,int k,
          vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
          *constraint_elements,int bk_min,int bk_max)

{
  exhaustive_solver<baryonyx::itm::maximize_tag,double> *this_00;
  iterator __position;
  bool bVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int j_1;
  int nb_solution;
  int start_it_flat_constraints;
  int local_58;
  int local_54;
  uint local_50;
  int local_4c;
  int local_48;
  int local_44;
  ulong local_40;
  int local_34;
  
  uVar5 = (long)(constraint_elements->
                super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(constraint_elements->
                super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                )._M_impl.super__Vector_impl_data._M_start;
  local_4c = (int)((ulong)(*(long *)(this + 0x20) - *(long *)(this + 0x18)) >> 2);
  local_54 = 0;
  local_48 = bk_max;
  local_44 = bk_min;
  local_34 = k;
  if (k < 0) {
    build_constraints<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
              ();
LAB_0052f1a2:
    build_constraints<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
              ();
  }
  else {
    uVar4 = (uint)(uVar5 >> 3);
    if ((int)uVar4 < 1) goto LAB_0052f1a2;
    this_00 = this + 0x30;
    local_50 = local_50 & 0xffffff00;
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              ((vector<signed_char,_std::allocator<signed_char>_> *)this_00,(long)uVar5 >> 3,
               (value_type_conflict *)&local_50);
    *(undefined1 *)(*(long *)(this + 0x38) + -1) = 1;
    uVar5 = (ulong)(uVar4 & 0x7fffffff);
    local_40 = 0;
    do {
      local_58 = ~*(uint *)(this + 0x30) + *(int *)(this + 0x38);
      do {
        uVar6 = 0;
        iVar2 = 0;
        do {
          if (*(char *)(*(long *)this_00 + uVar6) != '\0') {
            iVar2 = iVar2 + (constraint_elements->
                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar6].factor;
          }
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
        if ((local_44 <= iVar2) && (iVar2 <= local_48)) {
          local_54 = local_54 + 1;
          uVar6 = 0;
          do {
            if (*(char *)(*(long *)this_00 + uVar6) == '\0') {
              local_50 = 0;
            }
            else {
              local_50 = (constraint_elements->
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         )._M_impl.super__Vector_impl_data._M_start[uVar6].factor;
            }
            __position._M_current = *(int **)(this + 0x20);
            if (__position._M_current == *(int **)(this + 0x28)) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)(this + 0x18),__position,
                         (int *)&local_50);
            }
            else {
              *__position._M_current = local_50;
              *(int **)(this + 0x20) = __position._M_current + 1;
            }
            uVar6 = uVar6 + 1;
          } while (uVar5 != uVar6);
        }
        lVar3 = (long)local_58;
        *(char *)(*(long *)this_00 + lVar3) = *(char *)(*(long *)this_00 + lVar3) + '\x01';
        bVar1 = false;
        if ('\x01' < *(char *)(*(long *)this_00 + lVar3)) {
          *(undefined1 *)(*(long *)this_00 + lVar3) = 0;
          if (local_58 == 0) {
            local_40 = 1;
            local_58 = 0;
          }
          else {
            local_58 = local_58 + -1;
            bVar1 = true;
          }
        }
      } while ((bVar1) && ((local_40 & 1) == 0));
    } while ((local_40 & 1) == 0);
    if (-1 < local_4c) {
      if (0 < local_54) {
        std::
        _Rb_tree<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint,baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint,std::_Identity<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint>,std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint>,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint>>
        ::_M_emplace_unique<int&,int_const&,int&,int&,int&>
                  ((_Rb_tree<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint,baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint,std::_Identity<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint>,std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint>,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint>>
                    *)(this + 0x48),&local_34,&local_4c,&local_54,&local_44,&local_48);
        return;
      }
      goto LAB_0052f1ac;
    }
  }
  build_constraints<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
            ();
LAB_0052f1ac:
  build_constraints<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
            ();
}

Assistant:

void build_constraints(int k,
                           const C& constraint_elements,
                           int bk_min,
                           int bk_max)
    {
        const auto constraint_size = length(constraint_elements);
        const auto start_it_flat_constraints = length(flat_constraints);
        auto nb_solution = 0;

        bx_ensures(k >= 0);
        bx_ensures(constraint_size > 0);

        walkers.resize(constraint_elements.size(), 0);
        walkers.back() = 1;
        bool end = false;

        do {
            auto i = length(walkers) - 1;

            do {
                int sum = 0;
                for (int j = 0; j != constraint_size; ++j)
                    if (walkers[j])
                        sum += constraint_elements[j].factor;

                if (bk_min <= sum && sum <= bk_max) {
                    ++nb_solution;
                    for (int j = 0; j != constraint_size; ++j) {
                        flat_constraints.emplace_back(
                          walkers[j] ? constraint_elements[j].factor : 0);
                    }
                }

                ++walkers[i];

                if (walkers[i] > 1) {
                    walkers[i] = 0;

                    if (i == 0) {
                        end = true;
                        break;
                    } else {
                        --i;
                    }
                } else {
                    break;
                }
            } while (!end);
        } while (!end);

        bx_expects(start_it_flat_constraints >= 0);
        bx_expects(nb_solution > 0);

        constraints.emplace(
          k, start_it_flat_constraints, nb_solution, bk_min, bk_max);
    }